

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O1

uint32_t __thiscall wabt::Opcode::GetSimdLaneCount(Opcode *this)

{
  switch(this->enum_) {
  case I8X16ExtractLaneS:
  case I8X16ExtractLaneU:
  case I8X16ReplaceLane:
switchD_0012ba0e_caseD_ee:
    return 0x10;
  case I16X8ExtractLaneS:
  case I16X8ExtractLaneU:
  case I16X8ReplaceLane:
switchD_0012ba0e_caseD_f1:
    return 8;
  case I32X4ExtractLane:
  case I32X4ReplaceLane:
  case F32X4ExtractLane:
  case F32X4ReplaceLane:
switchD_0012ba0e_caseD_f4:
    return 4;
  case I64X2ExtractLane:
  case I64X2ReplaceLane:
  case F64X2ExtractLane:
  case F64X2ReplaceLane:
switchD_0012ba0e_caseD_f6:
    return 2;
  default:
    switch(this->enum_) {
    case V128Load8Lane:
    case V128Store8Lane:
      goto switchD_0012ba0e_caseD_ee;
    case V128Load16Lane:
    case V128Store16Lane:
      goto switchD_0012ba0e_caseD_f1;
    case V128Load32Lane:
    case V128Store32Lane:
      goto switchD_0012ba0e_caseD_f4;
    case V128Load64Lane:
    case V128Store64Lane:
      goto switchD_0012ba0e_caseD_f6;
    default:
      abort();
    }
  }
}

Assistant:

uint32_t Opcode::GetSimdLaneCount() const {
  switch (enum_) {
    case Opcode::I8X16ExtractLaneS:
    case Opcode::I8X16ExtractLaneU:
    case Opcode::I8X16ReplaceLane:
    case Opcode::V128Load8Lane:
    case Opcode::V128Store8Lane:
      return 16;
      break;
    case Opcode::I16X8ExtractLaneS:
    case Opcode::I16X8ExtractLaneU:
    case Opcode::I16X8ReplaceLane:
    case Opcode::V128Load16Lane:
    case Opcode::V128Store16Lane:
      return 8;
      break;
    case Opcode::F32X4ExtractLane:
    case Opcode::F32X4ReplaceLane:
    case Opcode::I32X4ExtractLane:
    case Opcode::I32X4ReplaceLane:
    case Opcode::V128Load32Lane:
    case Opcode::V128Store32Lane:
      return 4;
      break;
    case Opcode::F64X2ExtractLane:
    case Opcode::F64X2ReplaceLane:
    case Opcode::I64X2ExtractLane:
    case Opcode::I64X2ReplaceLane:
    case Opcode::V128Load64Lane:
    case Opcode::V128Store64Lane:
      return 2;
      break;
    default:
      WABT_UNREACHABLE;
  }
}